

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  FunctionPortSyntax *pFVar2;
  Token TVar3;
  Token *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_00000028;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000030;
  DeclaratorSyntax *in_stack_00000038;
  BumpAllocator *in_stack_000000c8;
  Token *in_stack_000000d0;
  BumpAllocator *in_stack_ffffffffffffff78;
  DeclaratorSyntax *in_stack_ffffffffffffff80;
  Token *args_4;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000030,in_stack_00000028);
  TVar3 = parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  args_4 = (Token *)TVar3.info;
  parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  lVar1._0_2_ = ((Token *)((long)__fn + 0x90))->kind;
  lVar1._2_1_ = ((Token *)((long)__fn + 0x90))->field_0x2;
  lVar1._3_1_ = ((Token *)((long)__fn + 0x90))->numFlags;
  lVar1._4_4_ = ((Token *)((long)__fn + 0x90))->rawLen;
  if (lVar1 != 0) {
    deepClone<slang::syntax::DataTypeSyntax>
              ((DataTypeSyntax *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  not_null<slang::syntax::DeclaratorSyntax_*>::operator*
            ((not_null<slang::syntax::DeclaratorSyntax_*> *)0x81b275);
  deepClone<slang::syntax::DeclaratorSyntax>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pFVar2 = BumpAllocator::
           emplace<slang::syntax::FunctionPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::DataTypeSyntax*,slang::syntax::DeclaratorSyntax&>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(Token *)__fn,
                      (Token *)__child_stack,args_4,(DataTypeSyntax **)in_stack_00000030,
                      in_stack_00000038);
  return (int)pFVar2;
}

Assistant:

static SyntaxNode* clone(const FunctionPortSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<FunctionPortSyntax>(
        *deepClone(node.attributes, alloc),
        node.constKeyword.deepClone(alloc),
        node.direction.deepClone(alloc),
        node.staticKeyword.deepClone(alloc),
        node.varKeyword.deepClone(alloc),
        node.dataType ? deepClone(*node.dataType, alloc) : nullptr,
        *deepClone<DeclaratorSyntax>(*node.declarator, alloc)
    );
}